

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.c
# Opt level: O1

int map_goto(int state,int symbol)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = goto_map[symbol];
  iVar2 = goto_map[(long)symbol + 1];
  if (iVar3 <= iVar2) {
    do {
      iVar1 = iVar2 + iVar3 >> 1;
      if (from_state[iVar1] == state) {
        return iVar1;
      }
      if (from_state[iVar1] < state) {
        iVar3 = iVar1 + 1;
      }
      else {
        iVar2 = iVar1 + -1;
      }
    } while (iVar3 <= iVar2);
  }
  __assert_fail("low <= high",
                "/workspace/llm4binary/github/license_c_cmakelists/ChrisDodd[P]btyacc/lalr.c",0xf4,
                "int map_goto(int, int)");
}

Assistant:

int map_goto(int state, int symbol)
{
    register int high;
    register int low;
    register int middle;
    register int s;

    low = goto_map[symbol];
    high = goto_map[symbol + 1];

    for (;;)
    {
	assert(low <= high);
	middle = (low + high) >> 1;
	s = from_state[middle];
	if (s == state)
	    return (middle);
	else if (s < state)
	    low = middle + 1;
	else
	    high = middle - 1;
    }
}